

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool anon_unknown.dwarf_8f1b29::AddContextSpecificSymbols
               (TBuiltInResource *resources,TInfoSink *infoSink,TSymbolTable *symbolTable,
               int version,EProfile profile,SpvVersion *spvVersion,EShLanguage language,
               EShSource source)

{
  bool bVar1;
  int iVar2;
  TBuiltInParseables *__p;
  pointer pTVar3;
  undefined4 extraout_var;
  unique_ptr<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
  local_40;
  unique_ptr<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
  builtInParseables;
  SpvVersion *spvVersion_local;
  EProfile profile_local;
  int version_local;
  TSymbolTable *symbolTable_local;
  TInfoSink *infoSink_local;
  TBuiltInResource *resources_local;
  
  builtInParseables._M_t.
  super___uniq_ptr_impl<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
  ._M_t.
  super__Tuple_impl<0UL,_glslang::TBuiltInParseables_*,_std::default_delete<glslang::TBuiltInParseables>_>
  .super__Head_base<0UL,_glslang::TBuiltInParseables_*,_false>._M_head_impl =
       (__uniq_ptr_data<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>,_true,_true>
        )(__uniq_ptr_data<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>,_true,_true>
          )spvVersion;
  __p = CreateBuiltInParseables(infoSink,source);
  std::unique_ptr<glslang::TBuiltInParseables,std::default_delete<glslang::TBuiltInParseables>>::
  unique_ptr<std::default_delete<glslang::TBuiltInParseables>,void>
            ((unique_ptr<glslang::TBuiltInParseables,std::default_delete<glslang::TBuiltInParseables>>
              *)&local_40,__p);
  bVar1 = std::operator==(&local_40,(nullptr_t)0x0);
  if (bVar1) {
    resources_local._7_1_ = false;
  }
  else {
    pTVar3 = std::
             unique_ptr<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
             ::operator->(&local_40);
    (*pTVar3->_vptr_TBuiltInParseables[3])
              (pTVar3,resources,(ulong)(uint)version,(ulong)profile,
               builtInParseables._M_t.
               super___uniq_ptr_impl<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
               ._M_t.
               super__Tuple_impl<0UL,_glslang::TBuiltInParseables_*,_std::default_delete<glslang::TBuiltInParseables>_>
               .super__Head_base<0UL,_glslang::TBuiltInParseables_*,_false>._M_head_impl,
               (ulong)language);
    pTVar3 = std::
             unique_ptr<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
             ::operator->(&local_40);
    iVar2 = (*pTVar3->_vptr_TBuiltInParseables[4])();
    bVar1 = InitializeSymbolTable
                      ((TString *)CONCAT44(extraout_var,iVar2),version,profile,
                       (SpvVersion *)
                       builtInParseables._M_t.
                       super___uniq_ptr_impl<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_glslang::TBuiltInParseables_*,_std::default_delete<glslang::TBuiltInParseables>_>
                       .super__Head_base<0UL,_glslang::TBuiltInParseables_*,_false>._M_head_impl,
                       language,source,infoSink,symbolTable);
    if (bVar1) {
      pTVar3 = std::
               unique_ptr<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
               ::operator->(&local_40);
      (*pTVar3->_vptr_TBuiltInParseables[7])
                (pTVar3,(ulong)(uint)version,(ulong)profile,
                 builtInParseables._M_t.
                 super___uniq_ptr_impl<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_glslang::TBuiltInParseables_*,_std::default_delete<glslang::TBuiltInParseables>_>
                 .super__Head_base<0UL,_glslang::TBuiltInParseables_*,_false>._M_head_impl,
                 (ulong)language,symbolTable,resources);
      resources_local._7_1_ = true;
    }
    else {
      resources_local._7_1_ = false;
    }
  }
  std::unique_ptr<glslang::TBuiltInParseables,_std::default_delete<glslang::TBuiltInParseables>_>::
  ~unique_ptr(&local_40);
  return resources_local._7_1_;
}

Assistant:

bool AddContextSpecificSymbols(const TBuiltInResource* resources, TInfoSink& infoSink, TSymbolTable& symbolTable, int version,
                               EProfile profile, const SpvVersion& spvVersion, EShLanguage language, EShSource source)
{
    std::unique_ptr<TBuiltInParseables> builtInParseables(CreateBuiltInParseables(infoSink, source));

    if (builtInParseables == nullptr)
        return false;

    builtInParseables->initialize(*resources, version, profile, spvVersion, language);
    if (!InitializeSymbolTable(builtInParseables->getCommonString(), version, profile, spvVersion, language, source, infoSink, symbolTable))
        return false;
    builtInParseables->identifyBuiltIns(version, profile, spvVersion, language, symbolTable, *resources);

    return true;
}